

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer *ppptVar1;
  size_t sVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  type_info **pptVar6;
  iterator __position;
  type_info *ptVar7;
  internals *piVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  size_t *psVar11;
  __hash_code __code;
  type_info **pptVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  ulong uVar16;
  ulong uVar17;
  __node_base_ptr p_Var18;
  size_t *psVar19;
  _Hash_node_base *p_Var20;
  type_info *tinfo;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  handle local_60;
  void *local_58;
  iterator iStack_50;
  _typeobject **local_48;
  _typeobject *local_38;
  
  local_58 = (void *)0x0;
  iStack_50._M_current = (_typeobject **)0x0;
  local_48 = (_typeobject **)0x0;
  local_60.m_ptr = t->tp_bases;
  if ((type_info *)local_60.m_ptr != (type_info *)0x0) {
    ((type_info *)local_60.m_ptr)->type =
         (PyTypeObject *)
         ((long)&(((type_info *)local_60.m_ptr)->type->ob_base).ob_base.ob_refcnt + 1);
  }
  psVar11 = &((type_info *)local_60.m_ptr)->type_align;
  uVar14 = (uint)*(undefined8 *)(((type_info *)local_60.m_ptr)->cpptype + 0xa8);
  psVar19 = psVar11;
  if ((uVar14 >> 0x19 & 1) != 0) {
    psVar19 = (size_t *)*psVar11;
  }
  sVar2 = ((type_info *)local_60.m_ptr)->type_size;
  if ((uVar14 >> 0x19 & 1) != 0) {
    psVar11 = (size_t *)*psVar11;
  }
  if (psVar19 != psVar11 + sVar2) {
    do {
      local_38 = (_typeobject *)*psVar19;
      if (iStack_50._M_current == local_48) {
        std::vector<_typeobject*,std::allocator<_typeobject*>>::_M_realloc_insert<_typeobject*>
                  ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,iStack_50,
                   &local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar11 + sVar2);
  }
  object::~object((object *)&local_60);
  piVar8 = get_internals();
  if ((long)iStack_50._M_current - (long)local_58 != 0) {
    uVar17 = (long)iStack_50._M_current - (long)local_58 >> 3;
    uVar16 = 0;
    do {
      p_Var20 = *(_Hash_node_base **)((long)local_58 + uVar16 * 8);
      if (((ulong)p_Var20[1]._M_nxt[0x15]._M_nxt & 0x80000000) != 0) {
        uVar3 = (piVar8->registered_types_py)._M_h._M_bucket_count;
        uVar15 = (ulong)p_Var20 % uVar3;
        p_Var4 = (piVar8->registered_types_py)._M_h._M_buckets[uVar15];
        p_Var9 = (__node_base_ptr)0x0;
        if ((p_Var4 != (__node_base_ptr)0x0) &&
           (p_Var9 = p_Var4, p_Var18 = p_Var4->_M_nxt, p_Var20 != p_Var4->_M_nxt[1]._M_nxt)) {
          while (p_Var10 = p_Var18->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
            p_Var9 = (__node_base_ptr)0x0;
            if (((ulong)p_Var10[1]._M_nxt % uVar3 != uVar15) ||
               (p_Var9 = p_Var18, p_Var18 = p_Var10, p_Var20 == p_Var10[1]._M_nxt))
            goto LAB_0010bdd4;
          }
          p_Var9 = (__node_base_ptr)0x0;
        }
LAB_0010bdd4:
        if (p_Var9 == (__node_base_ptr)0x0) {
          p_Var10 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var10 = p_Var9->_M_nxt;
        }
        if (p_Var10 == (_Hash_node_base *)0x0) {
          ptVar7 = (type_info *)p_Var20[0x2a]._M_nxt;
          if (ptVar7 != (type_info *)0x0) {
            if (uVar16 + 1 == uVar17) {
              iStack_50._M_current = iStack_50._M_current + -1;
              uVar16 = uVar16 - 1;
            }
            ptVar7->type = (PyTypeObject *)((long)&(ptVar7->type->ob_base).ob_base.ob_refcnt + 1);
            psVar11 = &ptVar7->type_align;
            uVar14 = (uint)*(undefined8 *)(ptVar7->cpptype + 0xa8);
            psVar19 = psVar11;
            if ((uVar14 >> 0x19 & 1) != 0) {
              psVar19 = (size_t *)*psVar11;
            }
            sVar2 = ptVar7->type_size;
            if ((uVar14 >> 0x19 & 1) != 0) {
              psVar11 = (size_t *)*psVar11;
            }
            local_60.m_ptr = (PyObject *)ptVar7;
            for (; psVar19 != psVar11 + sVar2; psVar19 = psVar19 + 1) {
              local_38 = (_typeobject *)*psVar19;
              if (iStack_50._M_current == local_48) {
                std::vector<_typeobject*,std::allocator<_typeobject*>>::
                _M_realloc_insert<_typeobject*>
                          ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,iStack_50,
                           &local_38);
              }
              else {
                *iStack_50._M_current = local_38;
                iStack_50._M_current = iStack_50._M_current + 1;
              }
            }
            object::~object((object *)&local_60);
          }
        }
        else {
          p_Var5 = p_Var10[3]._M_nxt;
          for (p_Var20 = p_Var10[2]._M_nxt; p_Var20 != p_Var5; p_Var20 = p_Var20 + 1) {
            local_60.m_ptr = (PyObject *)p_Var20->_M_nxt;
            pptVar6 = (bases->
                      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            __position._M_current =
                 (bases->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (pptVar6 == __position._M_current) {
LAB_0010be2f:
              if (__position._M_current ==
                  (bases->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
                _M_realloc_insert<pybind11::detail::type_info*const&>
                          ((vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
                            *)bases,__position,(type_info **)&local_60);
              }
              else {
                *__position._M_current = (type_info *)local_60.m_ptr;
                ppptVar1 = &(bases->
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *ppptVar1 = *ppptVar1 + 1;
              }
            }
            else {
              do {
                pptVar12 = pptVar6 + 1;
                bVar13 = false;
                if (*pptVar6 == (type_info *)local_60.m_ptr) {
                  bVar13 = true;
                  break;
                }
                pptVar6 = pptVar12;
              } while (pptVar12 != __position._M_current);
              if (!bVar13) goto LAB_0010be2f;
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
      uVar17 = (long)iStack_50._M_current - (long)local_58 >> 3;
    } while (uVar16 < uVar17);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases)) {
        check.push_back((PyTypeObject *) parent.ptr());
    }

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto *type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) {
            continue;
        }

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before:
            // we want to follow Python/virtual C++ rules that there should only be one instance of
            // a common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) {
                        found = true;
                        break;
                    }
                }
                if (!found) {
                    bases.push_back(tinfo);
                }
            }
        } else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases)) {
                check.push_back((PyTypeObject *) parent.ptr());
            }
        }
    }
}